

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonRemoveFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  JsonParse *p;
  uchar *zPath;
  ulong uVar2;
  
  if (0 < argc) {
    p = jsonParseFuncArg(ctx,*argv,(uint)(argc != 1));
    if (p != (JsonParse *)0x0) {
      uVar2 = 1;
      do {
        if ((uint)argc == uVar2) {
          jsonReturnParse(ctx,p);
          goto LAB_00191cf7;
        }
        zPath = sqlite3_value_text(argv[uVar2]);
        if (zPath == (uchar *)0x0) goto LAB_00191cf7;
        if (*zPath != '$') goto LAB_00191cbc;
        if (zPath[1] == '\0') goto LAB_00191cf7;
        p->eEdit = '\x01';
        p->delta = 0;
        uVar1 = jsonLookupStep(p,0,(char *)(zPath + 1),0);
        uVar2 = uVar2 + 1;
      } while (uVar1 == 0xfffffffe || uVar1 < 0xfffffffd);
      if (uVar1 == 0xfffffffd) {
LAB_00191cbc:
        jsonBadPathError(ctx,(char *)zPath);
      }
      else {
        sqlite3_result_error(ctx,"malformed JSON",-1);
      }
LAB_00191cf7:
      jsonParseFree(p);
      return;
    }
  }
  return;
}

Assistant:

static void jsonRemoveFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  const char *zPath = 0; /* Path of element to be removed */
  int i;                 /* Loop counter */
  u32 rc;                /* Subroutine return code */

  if( argc<1 ) return;
  p = jsonParseFuncArg(ctx, argv[0], argc>1 ? JSON_EDITABLE : 0);
  if( p==0 ) return;
  for(i=1; i<argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    if( zPath==0 ){
      goto json_remove_done;
    }
    if( zPath[0]!='$' ){
      goto json_remove_patherror;
    }
    if( zPath[1]==0 ){
      /* json_remove(j,'$') returns NULL */
      goto json_remove_done;
    }
    p->eEdit = JEDIT_DEL;
    p->delta = 0;
    rc = jsonLookupStep(p, 0, zPath+1, 0);
    if( JSON_LOOKUP_ISERROR(rc) ){
      if( rc==JSON_LOOKUP_NOTFOUND ){
        continue;  /* No-op */
      }else if( rc==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      goto json_remove_done;
    }
  }
  jsonReturnParse(ctx, p);
  jsonParseFree(p);
  return;

json_remove_patherror:
  jsonBadPathError(ctx, zPath);

json_remove_done:
  jsonParseFree(p);
  return;
}